

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

int main(void)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  initializer_list<float> __l_12;
  initializer_list<float> __l_13;
  initializer_list<float> __l_14;
  initializer_list<float> __l_15;
  initializer_list<float> __l_16;
  initializer_list<float> __l_17;
  initializer_list<float> __l_18;
  initializer_list<float> __l_19;
  initializer_list<float> __l_20;
  initializer_list<float> __l_21;
  initializer_list<float> __l_22;
  initializer_list<float> __l_23;
  initializer_list<float> __l_24;
  initializer_list<float> __l_25;
  initializer_list<float> __l_26;
  initializer_list<float> __l_27;
  initializer_list<float> __l_28;
  initializer_list<float> __l_29;
  initializer_list<float> __l_30;
  initializer_list<float> __l_31;
  initializer_list<float> __l_32;
  initializer_list<float> __l_33;
  initializer_list<float> __l_34;
  initializer_list<float> __l_35;
  initializer_list<float> __l_36;
  initializer_list<float> __l_37;
  initializer_list<float> __l_38;
  initializer_list<float> __l_39;
  initializer_list<float> __l_40;
  initializer_list<float> __l_41;
  initializer_list<float> __l_42;
  initializer_list<float> __l_43;
  initializer_list<float> __l_44;
  initializer_list<float> __l_45;
  initializer_list<float> __l_46;
  initializer_list<float> __l_47;
  initializer_list<float> __l_48;
  initializer_list<float> __l_49;
  initializer_list<float> __l_50;
  initializer_list<float> __l_51;
  initializer_list<int> __l_52;
  initializer_list<float> __l_53;
  initializer_list<float> __l_54;
  initializer_list<int> __l_55;
  initializer_list<float> __l_56;
  initializer_list<float> __l_57;
  initializer_list<int> __l_58;
  initializer_list<float> __l_59;
  initializer_list<float> __l_60;
  initializer_list<int> __l_61;
  initializer_list<float> __l_62;
  initializer_list<float> __l_63;
  initializer_list<int> __l_64;
  initializer_list<float> __l_65;
  initializer_list<float> __l_66;
  initializer_list<int> __l_67;
  initializer_list<float> __l_68;
  initializer_list<float> __l_69;
  initializer_list<int> __l_70;
  initializer_list<float> __l_71;
  initializer_list<float> __l_72;
  initializer_list<int> __l_73;
  initializer_list<float> __l_74;
  initializer_list<float> __l_75;
  initializer_list<int> __l_76;
  initializer_list<float> __l_77;
  initializer_list<int> __l_78;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_79;
  initializer_list<float> __l_80;
  initializer_list<int> __l_81;
  initializer_list<float> __l_82;
  initializer_list<float> __l_83;
  initializer_list<int> __l_84;
  initializer_list<float> __l_85;
  initializer_list<float> __l_86;
  initializer_list<float> __l_87;
  initializer_list<float> __l_88;
  initializer_list<float> __l_89;
  initializer_list<float> __l_90;
  initializer_list<float> __l_91;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe040;
  allocator_type *in_stack_ffffffffffffe058;
  allocator<char> *in_stack_ffffffffffffe060;
  allocator<char> *__a;
  iterator in_stack_ffffffffffffe068;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_stack_ffffffffffffe090;
  int n;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe098;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe0a0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe0a8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe0b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffe0b8;
  undefined8 in_stack_ffffffffffffe0c0;
  undefined8 in_stack_ffffffffffffe0c8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe0d0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe0d8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe0e0;
  float min_p;
  undefined1 *puVar1;
  string *samplers_sequence;
  undefined1 ***local_1e70;
  allocator<char> local_1bc1;
  string local_1bc0 [39];
  allocator<char> local_1b99;
  string local_1b98 [39];
  allocator<char> local_1b71;
  string local_1b70 [39];
  allocator<char> local_1b49;
  string local_1b48 [39];
  undefined1 local_1b21 [40];
  allocator<char> local_1af9;
  string local_1af8 [39];
  allocator<char> local_1ad1;
  string local_1ad0 [39];
  allocator<char> local_1aa9;
  string local_1aa8 [39];
  allocator<char> local_1a81;
  string local_1a80 [39];
  allocator<char> local_1a59;
  string local_1a58 [39];
  allocator<char> local_1a31;
  string local_1a30 [39];
  allocator<char> local_1a09;
  string local_1a08 [39];
  allocator<char> local_19e1;
  string local_19e0 [39];
  allocator<char> local_19b9;
  string local_19b8 [39];
  allocator<char> local_1991;
  string local_1990 [39];
  allocator<char> local_1969;
  string local_1968 [39];
  allocator<char> local_1941;
  string local_1940 [39];
  allocator<char> local_1919;
  string local_1918 [39];
  allocator<char> local_18f1;
  string local_18f0 [39];
  allocator<char> local_18c9;
  string local_18c8 [39];
  allocator<char> local_18a1;
  string local_18a0 [39];
  allocator<char> local_1879;
  string local_1878 [39];
  allocator<char> local_1851;
  string local_1850 [39];
  allocator<char> local_1829;
  string local_1828 [40];
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 *local_17f0;
  undefined8 local_17e8;
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 *local_17b0;
  undefined8 local_17a8;
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 *local_1770;
  undefined8 local_1768;
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 *local_1730;
  undefined8 local_1728;
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 *local_16f0;
  undefined8 local_16e8;
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 *local_16b0;
  undefined8 local_16a8;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined4 local_1658;
  undefined8 *local_1648;
  undefined8 local_1640;
  undefined8 local_1618;
  undefined4 uStack_1610;
  undefined4 local_160c;
  undefined4 uStack_1608;
  undefined8 uStack_1604;
  undefined8 *local_15f8;
  undefined8 local_15f0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined4 local_15b8;
  undefined8 *local_15b0;
  undefined8 local_15a8;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined1 local_1569;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined4 local_1558;
  undefined8 *local_1548;
  undefined8 local_1540;
  undefined1 local_1519;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined4 local_1508;
  undefined8 *local_14f8;
  undefined8 local_14f0;
  string local_14c9;
  undefined1 *local_14a8;
  undefined8 local_14a0;
  undefined1 local_147e;
  undefined4 local_147c;
  undefined4 *local_1478;
  undefined8 local_1470;
  undefined8 **local_1468;
  undefined1 **local_1460 [3];
  undefined8 **local_1448;
  undefined8 local_1440;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined4 local_1408;
  undefined8 *local_13f8;
  undefined8 local_13f0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 *local_13a8;
  undefined8 local_13a0;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined4 local_1368;
  undefined8 *local_1360;
  undefined8 local_1358;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined4 local_130c;
  undefined4 *local_1308;
  undefined8 local_1300;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined4 local_12c8;
  undefined8 *local_12c0;
  undefined8 local_12b8;
  undefined4 local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined4 *local_1280;
  undefined8 local_1278;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined4 local_1230;
  undefined4 local_122c;
  undefined4 local_1228;
  undefined4 local_1224;
  undefined4 *local_1220;
  undefined8 local_1218;
  undefined4 local_11f0;
  undefined4 local_11ec;
  undefined4 *local_11e8;
  undefined8 local_11e0;
  undefined4 local_11b8;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined4 local_11ac;
  undefined4 *local_11a8;
  undefined8 local_11a0;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined4 local_1168;
  undefined8 *local_1158;
  undefined8 local_1150;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined4 local_1118;
  undefined8 *local_1108;
  undefined8 local_1100;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined4 local_10c8;
  undefined8 *local_10b8;
  undefined8 local_10b0;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined4 local_1078;
  undefined8 *local_1070;
  undefined8 local_1068;
  undefined4 local_1044;
  undefined4 local_1040;
  undefined4 local_103c;
  undefined4 *local_1038;
  undefined8 local_1030;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined4 local_ff8;
  undefined8 *local_fe8;
  undefined8 local_fe0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined4 local_fa8;
  undefined8 *local_f98;
  undefined8 local_f90;
  undefined4 local_f6c;
  undefined4 *local_f68;
  undefined8 local_f60;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined4 local_f28;
  undefined8 *local_f18;
  undefined8 local_f10;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined4 local_ed8;
  undefined8 *local_ec8;
  undefined8 local_ec0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined4 local_e88;
  undefined8 *local_e78;
  undefined8 local_e70;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined4 local_e38;
  undefined8 *local_e28;
  undefined8 local_e20;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined4 local_de8;
  undefined8 *local_de0;
  undefined8 local_dd8;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined4 local_dac;
  undefined4 *local_da8;
  undefined8 local_da0;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined4 local_d68;
  undefined8 *local_d58;
  undefined8 local_d50;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined4 local_d18;
  undefined8 *local_d08;
  undefined8 local_d00;
  undefined4 local_cdc;
  undefined4 *local_cd8;
  undefined8 local_cd0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined4 local_c98;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 *local_c58;
  undefined8 local_c50;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 *local_c18;
  undefined8 local_c10;
  undefined4 local_bec;
  undefined4 *local_be8;
  undefined8 local_be0;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 *local_ba8;
  undefined8 local_ba0;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 *local_b68;
  undefined8 local_b60;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 *local_b28;
  undefined8 local_b20;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 *local_af0;
  undefined8 local_ae8;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 *local_ab0;
  undefined8 local_aa8;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 *local_a78;
  undefined8 local_a70;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 *local_a38;
  undefined8 local_a30;
  undefined4 local_a0c;
  undefined4 *local_a08;
  undefined8 local_a00;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 *local_9c8;
  undefined8 local_9c0;
  undefined4 local_99c;
  undefined4 *local_998;
  undefined8 local_990;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 *local_958;
  undefined8 local_950;
  undefined4 local_92c;
  undefined4 *local_928;
  undefined8 local_920;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 *local_8e8;
  undefined8 local_8e0;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 *local_8b0;
  undefined8 local_8a8;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 *local_870;
  undefined8 local_868;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 *local_838;
  undefined8 local_830;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 *local_7f8;
  undefined8 local_7f0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 *local_7c0;
  undefined8 local_7b8;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined4 *local_780;
  undefined8 local_778;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 *local_748;
  undefined8 local_740;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 *local_708;
  undefined8 local_700;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 *local_6c8;
  undefined8 local_6c0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 *local_688;
  undefined8 local_680;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 *local_648;
  undefined8 local_640;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 *local_608;
  undefined8 local_600;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 *local_5c8;
  undefined8 local_5c0;
  undefined4 local_598;
  undefined4 local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 *local_588;
  undefined8 local_580;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 *local_550;
  undefined8 local_548;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 *local_510;
  undefined8 local_508;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 *local_4d8;
  undefined8 local_4d0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 *local_498;
  undefined8 local_490;
  undefined4 local_46c;
  undefined4 *local_468;
  undefined8 local_460;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 *local_428;
  undefined8 local_420;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 *local_3e8;
  undefined8 local_3e0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 *local_3a8;
  undefined8 local_3a0;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 *local_368;
  undefined8 local_360;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 *local_328;
  undefined8 local_320;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 *local_2f0;
  undefined8 local_2e8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 *local_2b0;
  undefined8 local_2a8;
  undefined4 local_284;
  undefined4 *local_280;
  undefined8 local_278;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 *local_240;
  undefined8 local_238;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 *local_200;
  undefined8 local_1f8;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 *local_1c0;
  undefined8 local_1b8;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 *local_180;
  undefined8 local_178;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 *local_140;
  undefined8 local_138;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 *local_100;
  undefined8 local_f8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined8 local_b8;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 *local_30;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = 0;
  ggml_time_init();
  local_40 = 0x3dcccccd;
  local_3c = 0x3e4ccccd;
  local_38 = 0x3e99999a;
  local_34 = 0x3ecccccd;
  local_30 = &local_40;
  local_28 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106524);
  __l._M_len = (size_type)in_stack_ffffffffffffe070;
  __l._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l,
             in_stack_ffffffffffffe058);
  local_90 = 0x3ecccccd;
  local_8c = 0x3e99999a;
  local_88 = 0x3e4ccccd;
  local_84 = 0x3dcccccd;
  local_80 = &local_90;
  local_78 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1065a8);
  __l_00._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_00,
             in_stack_ffffffffffffe058);
  test_temp(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
            (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106608);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106622);
  local_d0 = 0x3dcccccd;
  local_cc = 0x3e4ccccd;
  local_c8 = 0x3e99999a;
  local_c4 = 0x3ecccccd;
  local_c0 = &local_d0;
  local_b8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x10667f);
  __l_01._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_01,
             in_stack_ffffffffffffe058);
  local_110 = 0x3f800000;
  local_10c = 0;
  local_108 = 0;
  local_104 = 0;
  local_100 = &local_110;
  local_f8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106703);
  __l_02._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_02,
             in_stack_ffffffffffffe058);
  test_temp(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
            (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10675e);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106778);
  local_150 = 0x3dcccccd;
  local_14c = 0x3e4ccccd;
  local_148 = 0x3e99999a;
  local_144 = 0x3ecccccd;
  local_140 = &local_150;
  local_138 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1067d5);
  __l_03._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_03,
             in_stack_ffffffffffffe058);
  local_190 = 0x3ecccccd;
  local_18c = 0x3e99999a;
  local_188 = 0x3e4ccccd;
  local_184 = 0x3dcccccd;
  local_180 = &local_190;
  local_178 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106859);
  __l_04._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_04,
             in_stack_ffffffffffffe058);
  test_temp_ext(in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8,
                (float)((ulong)in_stack_ffffffffffffe0a0 >> 0x20),SUB84(in_stack_ffffffffffffe0a0,0)
                ,(float)((ulong)in_stack_ffffffffffffe098 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1068bf);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1068d9);
  local_1d0 = 0x3dcccccd;
  local_1cc = 0x3e4ccccd;
  local_1c8 = 0x3e99999a;
  local_1c4 = 0x3ecccccd;
  local_1c0 = &local_1d0;
  local_1b8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106936);
  __l_05._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_05,
             in_stack_ffffffffffffe058);
  local_210 = 0x3f800000;
  local_20c = 0;
  local_208 = 0;
  local_204 = 0;
  local_200 = &local_210;
  local_1f8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1069ba);
  __l_06._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_06._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_06,
             in_stack_ffffffffffffe058);
  test_temp_ext(in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8,
                (float)((ulong)in_stack_ffffffffffffe0a0 >> 0x20),SUB84(in_stack_ffffffffffffe0a0,0)
                ,(float)((ulong)in_stack_ffffffffffffe098 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106a20);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106a3a);
  local_250 = 0x3dcccccd;
  local_24c = 0x3e4ccccd;
  local_248 = 0x3e99999a;
  local_244 = 0x3ecccccd;
  local_240 = &local_250;
  local_238 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106a97);
  __l_07._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_07._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_07,
             in_stack_ffffffffffffe058);
  local_284 = 0x3f800000;
  local_280 = &local_284;
  local_278 = 1;
  std::allocator<float>::allocator((allocator<float> *)0x106afa);
  __l_08._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_08._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_08,
             in_stack_ffffffffffffe058);
  test_top_k(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (int)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106b57);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106b71);
  local_2c0 = 0x3dcccccd;
  local_2bc = 0x3e4ccccd;
  local_2b8 = 0x3e99999a;
  local_2b4 = 0x3ecccccd;
  local_2b0 = &local_2c0;
  local_2a8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106bce);
  __l_09._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_09._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_09,
             in_stack_ffffffffffffe058);
  local_2fc = 0x3ee38da4;
  local_2f8 = 0x3eaaaa3b;
  local_2f4 = 0x3e638da4;
  local_2f0 = &local_2fc;
  local_2e8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x106c47);
  __l_10._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_10._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_10,
             in_stack_ffffffffffffe058);
  test_top_k(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (int)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106ca4);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106cbe);
  local_338 = 0x3dcccccd;
  local_334 = 0x3e4ccccd;
  local_330 = 0x3e99999a;
  local_32c = 0x3ecccccd;
  local_328 = &local_338;
  local_320 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106d1b);
  __l_11._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_11._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_11,
             in_stack_ffffffffffffe058);
  local_378 = 0x3ecccccd;
  local_374 = 0x3e99999a;
  local_370 = 0x3e4ccccd;
  local_36c = 0x3dcccccd;
  local_368 = &local_378;
  local_360 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106d9f);
  __l_12._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_12._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_12,
             in_stack_ffffffffffffe058);
  test_top_k(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (int)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106dfc);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106e16);
  local_3b8 = 0x3dcccccd;
  local_3b4 = 0x3e4ccccd;
  local_3b0 = 0x3e99999a;
  local_3ac = 0x3ecccccd;
  local_3a8 = &local_3b8;
  local_3a0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106e73);
  __l_13._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_13._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_13,
             in_stack_ffffffffffffe058);
  local_3f8 = 0x3ecccccd;
  local_3f4 = 0x3e99999a;
  local_3f0 = 0x3e4ccccd;
  local_3ec = 0x3dcccccd;
  local_3e8 = &local_3f8;
  local_3e0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106ef7);
  __l_14._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_14._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_14,
             in_stack_ffffffffffffe058);
  test_top_k(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (int)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106f51);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x106f6b);
  local_438 = 0x3dcccccd;
  local_434 = 0x3e4ccccd;
  local_430 = 0x3e99999a;
  local_42c = 0x3ecccccd;
  local_428 = &local_438;
  local_420 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x106fc8);
  __l_15._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_15._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_15,
             in_stack_ffffffffffffe058);
  local_46c = 0x3f800000;
  local_468 = &local_46c;
  local_460 = 1;
  std::allocator<float>::allocator((allocator<float> *)0x10702b);
  __l_16._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_16._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_16,
             in_stack_ffffffffffffe058);
  test_top_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107086);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1070a0);
  local_4a8 = 0x3dcccccd;
  local_4a4 = 0x3e4ccccd;
  local_4a0 = 0x3e99999a;
  local_49c = 0x3ecccccd;
  local_498 = &local_4a8;
  local_490 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1070fd);
  __l_17._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_17._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_17,
             in_stack_ffffffffffffe058);
  local_4e0 = 0x3f12492c;
  local_4dc = 0x3edb6da8;
  local_4d8 = &local_4e0;
  local_4d0 = 2;
  std::allocator<float>::allocator((allocator<float> *)0x10716b);
  __l_18._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_18._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_18,
             in_stack_ffffffffffffe058);
  test_top_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1071cb);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1071e5);
  local_520 = 0x3dcccccd;
  local_51c = 0x3e4ccccd;
  local_518 = 0x3e99999a;
  local_514 = 0x3ecccccd;
  local_510 = &local_520;
  local_508 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107242);
  __l_19._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_19._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_19,
             in_stack_ffffffffffffe058);
  local_55c = 0x3ee38da4;
  local_558 = 0x3eaaaa3b;
  local_554 = 0x3e638da4;
  local_550 = &local_55c;
  local_548 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x1072bb);
  __l_20._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_20._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_20,
             in_stack_ffffffffffffe058);
  test_top_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10731b);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107335);
  local_598 = 0x3dcccccd;
  local_594 = 0x3e4ccccd;
  local_590 = 0x3e99999a;
  local_58c = 0x3ecccccd;
  local_588 = &local_598;
  local_580 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107392);
  __l_21._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_21._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_21,
             in_stack_ffffffffffffe058);
  local_5d8 = 0x3ecccccd;
  local_5d4 = 0x3e99999a;
  local_5d0 = 0x3e4ccccd;
  local_5cc = 0x3dcccccd;
  local_5c8 = &local_5d8;
  local_5c0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107416);
  __l_22._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_22._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_22,
             in_stack_ffffffffffffe058);
  test_top_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107476);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107490);
  local_618 = 0x3dcccccd;
  local_614 = 0x3e4ccccd;
  local_610 = 0x3e99999a;
  local_60c = 0x3ecccccd;
  local_608 = &local_618;
  local_600 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1074ed);
  __l_23._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_23._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_23,
             in_stack_ffffffffffffe058);
  local_658 = 0x3ecccccd;
  local_654 = 0x3e99999a;
  local_650 = 0x3e4ccccd;
  local_64c = 0x3dcccccd;
  local_648 = &local_658;
  local_640 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107571);
  __l_24._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_24._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_24,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1075cc);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1075e6);
  local_698 = 0x3dcccccd;
  local_694 = 0x3e4ccccd;
  local_690 = 0x3e99999a;
  local_68c = 0x3ecccccd;
  local_688 = &local_698;
  local_680 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107643);
  __l_25._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_25._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_25,
             in_stack_ffffffffffffe058);
  local_6d8 = 0x3ecccccd;
  local_6d4 = 0x3e99999a;
  local_6d0 = 0x3e4ccccd;
  local_6cc = 0x3dcccccd;
  local_6c8 = &local_6d8;
  local_6c0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1076c7);
  __l_26._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_26._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_26,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107727);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107741);
  local_718 = 0x3dcccccd;
  local_714 = 0x3e4ccccd;
  local_710 = 0x3e99999a;
  local_70c = 0x3ecccccd;
  local_708 = &local_718;
  local_700 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x10779e);
  __l_27._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_27._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_27,
             in_stack_ffffffffffffe058);
  local_754 = 0x3ee38e3a;
  local_750 = 0x3eaaaaab;
  local_74c = 0x3e638e3a;
  local_748 = &local_754;
  local_740 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x107817);
  __l_28._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_28._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_28,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107877);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107891);
  local_790 = 0x3dcccccd;
  local_78c = 0x3e4ccccd;
  local_788 = 0x3e99999a;
  local_784 = 0x3ecccccd;
  local_780 = &local_790;
  local_778 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1078ee);
  __l_29._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_29._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_29,
             in_stack_ffffffffffffe058);
  local_7cc = 0x3ee38e3a;
  local_7c8 = 0x3eaaaaab;
  local_7c4 = 0x3e638e3a;
  local_7c0 = &local_7cc;
  local_7b8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x107967);
  __l_30._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_30._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_30,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1079c7);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1079e1);
  local_808 = 0x3dcccccd;
  local_804 = 0x3e4ccccd;
  local_800 = 0x3e99999a;
  local_7fc = 0x3ecccccd;
  local_7f8 = &local_808;
  local_7f0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107a3e);
  __l_31._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_31._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_31,
             in_stack_ffffffffffffe058);
  local_840 = 0x3f124925;
  local_83c = 0x3edb6db8;
  local_838 = &local_840;
  local_830 = 2;
  std::allocator<float>::allocator((allocator<float> *)0x107aac);
  __l_32._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_32._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_32,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107b0c);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107b26);
  local_880 = 0x3dcccccd;
  local_87c = 0x3e4ccccd;
  local_878 = 0x3e99999a;
  local_874 = 0x3ecccccd;
  local_870 = &local_880;
  local_868 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107b83);
  __l_33._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_33._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_33,
             in_stack_ffffffffffffe058);
  local_8b8 = 0x3f124925;
  local_8b4 = 0x3edb6db8;
  local_8b0 = &local_8b8;
  local_8a8 = 2;
  std::allocator<float>::allocator((allocator<float> *)0x107bf1);
  __l_34._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_34._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_34,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107c51);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107c6b);
  local_8f8 = 0x3dcccccd;
  local_8f4 = 0x3e4ccccd;
  local_8f0 = 0x3e99999a;
  local_8ec = 0x3ecccccd;
  local_8e8 = &local_8f8;
  local_8e0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107cc8);
  __l_35._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_35._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_35,
             in_stack_ffffffffffffe058);
  local_92c = 0x3f800000;
  local_928 = &local_92c;
  local_920 = 1;
  std::allocator<float>::allocator((allocator<float> *)0x107d2b);
  __l_36._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_36._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_36,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107d8b);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107da5);
  local_968 = 0x3dcccccd;
  local_964 = 0x3e4ccccd;
  local_960 = 0x3e99999a;
  local_95c = 0x3ecccccd;
  local_958 = &local_968;
  local_950 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107e02);
  __l_37._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_37._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_37,
             in_stack_ffffffffffffe058);
  local_99c = 0x3f800000;
  local_998 = &local_99c;
  local_990 = 1;
  std::allocator<float>::allocator((allocator<float> *)0x107e65);
  __l_38._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_38._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_38,
             in_stack_ffffffffffffe058);
  test_min_p(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
             (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107ec5);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x107edf);
  printf("XTC should:\n");
  local_9d8 = 0x3ecccccd;
  local_9d4 = 0x3e99999a;
  local_9d0 = 0x3e4ccccd;
  local_9cc = 0x3dcccccd;
  local_9c8 = &local_9d8;
  local_9c0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x107f4a);
  __l_39._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_39._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_39,
             in_stack_ffffffffffffe058);
  local_a0c = 0x3dcccccd;
  local_a08 = &local_a0c;
  local_a00 = 1;
  std::allocator<float>::allocator((allocator<float> *)0x107fad);
  __l_40._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_40._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_40,
             in_stack_ffffffffffffe058);
  test_xtc(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
           (float)((ulong)in_stack_ffffffffffffe090 >> 0x20),(float)in_stack_ffffffffffffe090);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108015);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10802f);
  local_a48 = 0x3ecccccd;
  local_a44 = 0x3e99999a;
  local_a40 = 0x3e4ccccd;
  local_a3c = 0x3dcccccd;
  local_a38 = &local_a48;
  local_a30 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x10808c);
  __l_41._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_41._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_41,
             in_stack_ffffffffffffe058);
  local_a80 = 0x3e4ccccd;
  local_a7c = 0x3dcccccd;
  local_a78 = &local_a80;
  local_a70 = 2;
  std::allocator<float>::allocator((allocator<float> *)0x1080fa);
  __l_42._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_42._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_42,
             in_stack_ffffffffffffe058);
  test_xtc(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
           (float)((ulong)in_stack_ffffffffffffe090 >> 0x20),(float)in_stack_ffffffffffffe090);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108162);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10817c);
  local_ac0 = 0x3ecccccd;
  local_abc = 0x3e99999a;
  local_ab8 = 0x3e4ccccd;
  local_ab4 = 0x3dcccccd;
  local_ab0 = &local_ac0;
  local_aa8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1081d9);
  __l_43._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_43._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_43,
             in_stack_ffffffffffffe058);
  local_afc = 0x3e99999a;
  local_af8 = 0x3e4ccccd;
  local_af4 = 0x3dcccccd;
  local_af0 = &local_afc;
  local_ae8 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x108252);
  __l_44._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_44._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_44,
             in_stack_ffffffffffffe058);
  test_xtc(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
           (float)((ulong)in_stack_ffffffffffffe090 >> 0x20),(float)in_stack_ffffffffffffe090);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1082ba);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1082d4);
  printf("XTC should not:\n");
  local_b38 = 0x3ecccccd;
  local_b34 = 0x3e99999a;
  local_b30 = 0x3e4ccccd;
  local_b2c = 0x3dcccccd;
  local_b28 = &local_b38;
  local_b20 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x10833f);
  __l_45._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_45._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_45,
             in_stack_ffffffffffffe058);
  local_b78 = 0x3ecccccd;
  local_b74 = 0x3e99999a;
  local_b70 = 0x3e4ccccd;
  local_b6c = 0x3dcccccd;
  local_b68 = &local_b78;
  local_b60 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1083c3);
  __l_46._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_46._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_46,
             in_stack_ffffffffffffe058);
  test_xtc(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
           (float)((ulong)in_stack_ffffffffffffe090 >> 0x20),(float)in_stack_ffffffffffffe090);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10842b);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108445);
  local_bb8 = 0x3f7851ec;
  local_bb4 = 0x3c23d70a;
  local_bb0 = 0x3c23d70a;
  local_bac = 0x3c23d70a;
  local_ba8 = &local_bb8;
  local_ba0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1084a2);
  __l_47._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_47._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_47,
             in_stack_ffffffffffffe058);
  local_bec = 0x3f7851ec;
  local_be8 = &local_bec;
  local_be0 = 1;
  std::allocator<float>::allocator((allocator<float> *)0x108505);
  __l_48._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_48._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_48,
             in_stack_ffffffffffffe058);
  test_typical(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
               (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108565);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10857f);
  local_c28 = 0x3ecccccd;
  local_c24 = 0x3e4ccccd;
  local_c20 = 0x3e4ccccd;
  local_c1c = 0x3e4ccccd;
  local_c18 = &local_c28;
  local_c10 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x1085dc);
  __l_49._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_49._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_49,
             in_stack_ffffffffffffe058);
  local_c64 = 0x3e4ccccd;
  local_c60 = 0x3e4ccccd;
  local_c5c = 0x3e4ccccd;
  local_c58 = &local_c64;
  local_c50 = 3;
  std::allocator<float>::allocator((allocator<float> *)0x108655);
  __l_50._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_50._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_50,
             in_stack_ffffffffffffe058);
  test_typical(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,
               (float)((ulong)in_stack_ffffffffffffe090 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1086b5);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1086cf);
  local_ca8 = 0x3e4ccccd3e4ccccd;
  uStack_ca0 = 0x3e4ccccd3e4ccccd;
  local_c98 = 0x3e4ccccd;
  local_c90 = &local_ca8;
  local_c88 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x10871a);
  __l_51._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_51._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_51,
             in_stack_ffffffffffffe058);
  local_cdc = 0;
  local_cd8 = &local_cdc;
  local_cd0 = 1;
  std::allocator<int>::allocator((allocator<int> *)0x10877d);
  __l_52._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_52._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_52,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_d28 = 0x3e8000003e800000;
  uStack_d20 = 0x3e8000003e800000;
  local_d18 = 0;
  local_d08 = &local_d28;
  local_d00 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x1087ef);
  __l_53._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_53._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_53,
             in_stack_ffffffffffffe058);
  test_penalties(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
                 (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
                 (float)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10885d);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x108877);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108891);
  local_d78 = 0x3e4ccccd3e4ccccd;
  uStack_d70 = 0x3e4ccccd3e4ccccd;
  local_d68 = 0x3e4ccccd;
  local_d58 = &local_d78;
  local_d50 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x1088dc);
  __l_54._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_54._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_54,
             in_stack_ffffffffffffe058);
  local_db4 = 0;
  local_db0 = 1;
  local_dac = 2;
  local_da8 = &local_db4;
  local_da0 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x108955);
  __l_55._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_55._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_55,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_df8 = 0x3f0000003f000000;
  uStack_df0 = 0;
  local_de8 = 0;
  local_de0 = &local_df8;
  local_dd8 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x1089c7);
  __l_56._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_56._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_56,
             in_stack_ffffffffffffe058);
  test_penalties(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
                 (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
                 (float)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108a35);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x108a4f);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108a69);
  local_e48 = 0x3e4ccccd3e4ccccd;
  uStack_e40 = 0x3e4ccccd3e4ccccd;
  local_e38 = 0x3e4ccccd;
  local_e28 = &local_e48;
  local_e20 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x108ab4);
  __l_57._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_57._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_57,
             in_stack_ffffffffffffe058);
  local_e98 = 0x100000000;
  uStack_e90 = 2;
  local_e88 = 0;
  local_e78 = &local_e98;
  local_e70 = 5;
  std::allocator<int>::allocator((allocator<int> *)0x108b26);
  __l_58._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_58._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_58,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_ee8 = 0x3f0000003f000000;
  uStack_ee0 = 0;
  local_ed8 = 0;
  local_ec8 = &local_ee8;
  local_ec0 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x108b98);
  __l_59._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_59._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_59,
             in_stack_ffffffffffffe058);
  test_penalties(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
                 (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
                 (float)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108c06);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x108c20);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108c3a);
  local_f38 = 0x3e4ccccd3e4ccccd;
  uStack_f30 = 0x3e4ccccd3e4ccccd;
  local_f28 = 0x3e4ccccd;
  local_f18 = &local_f38;
  local_f10 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x108c85);
  __l_60._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_60._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_60,
             in_stack_ffffffffffffe058);
  local_f6c = 0;
  local_f68 = &local_f6c;
  local_f60 = 1;
  std::allocator<int>::allocator((allocator<int> *)0x108ce8);
  __l_61._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_61._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_61,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_fb8 = 0x3e7fff373e7fff37;
  uStack_fb0 = 0x3e7fff373e7fff37;
  local_fa8 = 0x37388ca4;
  local_f98 = &local_fb8;
  local_f90 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x108d5a);
  __l_62._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_62._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_62,
             in_stack_ffffffffffffe058);
  test_penalties(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
                 (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
                 (float)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108dcd);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x108de7);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108e01);
  local_1008 = 0x3e4ccccd3e4ccccd;
  uStack_1000 = 0x3e4ccccd3e4ccccd;
  local_ff8 = 0x3e4ccccd;
  local_fe8 = &local_1008;
  local_fe0 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x108e4c);
  __l_63._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_63._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_63,
             in_stack_ffffffffffffe058);
  local_1044 = 0;
  local_1040 = 1;
  local_103c = 2;
  local_1038 = &local_1044;
  local_1030 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x108ec5);
  __l_64._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_64._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_64,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1088 = 0x3efffb8b3efffb8b;
  uStack_1080 = 0x37c0f02037c0f020;
  local_1078 = 0x37c0f020;
  local_1070 = &local_1088;
  local_1068 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x108f37);
  __l_65._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_65._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_65,
             in_stack_ffffffffffffe058);
  test_penalties(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
                 (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
                 (float)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108faa);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x108fc4);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x108fde);
  local_10d8 = 0x3e4ccccd3e4ccccd;
  uStack_10d0 = 0x3e4ccccd3e4ccccd;
  local_10c8 = 0x3e4ccccd;
  local_10b8 = &local_10d8;
  local_10b0 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x109029);
  __l_66._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_66._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_66,
             in_stack_ffffffffffffe058);
  local_1128 = 0x100000000;
  uStack_1120 = 2;
  local_1118 = 0;
  local_1108 = &local_1128;
  local_1100 = 5;
  std::allocator<int>::allocator((allocator<int> *)0x10909b);
  __l_67._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_67._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_67,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1178 = 0x3efffcfc3efffcfc;
  uStack_1170 = 0x37c0f02037c0f020;
  local_1168 = 0;
  local_1158 = &local_1178;
  local_1150 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x10910d);
  __l_68._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_68._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_68,
             in_stack_ffffffffffffe058);
  test_penalties(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
                 (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
                 (float)((ulong)in_stack_ffffffffffffe0c0 >> 0x20));
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109180);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x10919a);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1091b4);
  local_11b8 = 0x3e800000;
  local_11b4 = 0x3e800000;
  local_11b0 = 0x3e800000;
  local_11ac = 0x3e800000;
  local_11a8 = &local_11b8;
  local_11a0 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109211);
  __l_69._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_69._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_69,
             in_stack_ffffffffffffe058);
  local_11f0 = 0;
  local_11ec = 1;
  local_11e8 = &local_11f0;
  local_11e0 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x10927f);
  __l_70._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_70._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_70,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1230 = 0x3e800000;
  local_122c = 0x3e800000;
  local_1228 = 0x3e800000;
  local_1224 = 0x3e800000;
  local_1220 = &local_1230;
  local_1218 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109303);
  __l_71._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_71._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_71,
             in_stack_ffffffffffffe058);
  local_1258 = 0;
  uStack_1250 = 0;
  local_1248 = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x109356);
  test_dry(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
           (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
           (int)((ulong)in_stack_ffffffffffffe0c0 >> 0x20),(int)in_stack_ffffffffffffe0c0,
           in_stack_ffffffffffffe0b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe040);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1093bf);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x1093d9);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x1093f3);
  local_1290 = 0x3e800000;
  local_128c = 0x3e800000;
  local_1288 = 0x3e800000;
  local_1284 = 0x3e800000;
  local_1280 = &local_1290;
  local_1278 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109450);
  __l_72._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_72._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_72,
             in_stack_ffffffffffffe058);
  local_12d8 = 0x100000000;
  uStack_12d0 = 2;
  local_12c8 = 1;
  local_12c0 = &local_12d8;
  local_12b8 = 5;
  std::allocator<int>::allocator((allocator<int> *)0x1094c2);
  __l_73._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_73._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_73,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1318 = 0x3e98064b;
  local_1314 = 0x3e98064b;
  local_1310 = 0x3e98064b;
  local_130c = 0x3ddfb507;
  local_1308 = &local_1318;
  local_1300 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109546);
  __l_74._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_74._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_74,
             in_stack_ffffffffffffe058);
  local_1338 = 0;
  uStack_1330 = 0;
  local_1328 = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x109599);
  test_dry(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
           (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
           (int)((ulong)in_stack_ffffffffffffe0c0 >> 0x20),(int)in_stack_ffffffffffffe0c0,
           in_stack_ffffffffffffe0b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe040);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109602);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x10961c);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109636);
  local_1378 = 0x3e4ccccd3e4ccccd;
  uStack_1370 = 0x3e4ccccd3e4ccccd;
  local_1368 = 0x3e4ccccd;
  local_1360 = &local_1378;
  local_1358 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x109681);
  __l_75._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_75._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_75,
             in_stack_ffffffffffffe058);
  local_13c8 = 0x100000000;
  uStack_13c0 = 0x400000003;
  local_13b8 = 0x100000000;
  local_13a8 = &local_13c8;
  local_13a0 = 6;
  std::allocator<int>::allocator((allocator<int> *)0x1096fa);
  __l_76._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_76._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_76,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1418 = 0x3e4ccccd3e4ccccd;
  uStack_1410 = 0x3e4ccccd3e4ccccd;
  local_1408 = 0x3e4ccccd;
  local_13f8 = &local_1418;
  local_13f0 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x10976c);
  __l_77._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_77._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_77,
             in_stack_ffffffffffffe058);
  local_147e = 1;
  local_1468 = local_1460;
  local_147c = 3;
  local_1478 = &local_147c;
  local_1470 = 1;
  std::allocator<int>::allocator((allocator<int> *)0x1097ef);
  __l_78._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_78._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_78,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_147e = 0;
  local_1448 = local_1460;
  local_1440 = 1;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x10984f);
  __l_79._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_79._M_array = in_stack_ffffffffffffe068;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffe060,__l_79,(allocator_type *)in_stack_ffffffffffffe058);
  test_dry(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
           (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
           (int)((ulong)in_stack_ffffffffffffe0c0 >> 0x20),(int)in_stack_ffffffffffffe0c0,
           in_stack_ffffffffffffe0b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe040);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1098d2);
  local_1e70 = (undefined1 ***)&local_1448;
  do {
    local_1e70 = local_1e70 + -3;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
    n = (int)((ulong)in_stack_ffffffffffffe090 >> 0x20);
  } while (local_1e70 != local_1460);
  std::allocator<int>::~allocator((allocator<int> *)0x109931);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10994b);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x109965);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10997f);
  local_14c9._1_8_ = 0x3e4ccccd3e4ccccd;
  local_14c9._9_8_ = 0x3e4ccccd3e4ccccd;
  local_14c9.field_2._M_allocated_capacity._1_4_ = 0x3e4ccccd;
  local_14a8 = &local_14c9.field_0x1;
  local_14a0 = 5;
  samplers_sequence = &local_14c9;
  std::allocator<float>::allocator((allocator<float> *)0x1099ca);
  __l_80._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_80._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_80,
             in_stack_ffffffffffffe058);
  local_1518 = 0x100000000;
  uStack_1510 = 2;
  local_1508 = 1;
  local_14f8 = &local_1518;
  local_14f0 = 5;
  puVar1 = &local_1519;
  std::allocator<int>::allocator((allocator<int> *)0x109a3c);
  __l_81._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_81._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_81,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1568 = 0x3e779f233e779f23;
  uStack_1560 = 0x3e779f233e779f23;
  local_1558 = 0x3d060cbf;
  local_1548 = &local_1568;
  local_1540 = 5;
  min_p = (float)((ulong)&local_1569 >> 0x20);
  std::allocator<float>::allocator((allocator<float> *)0x109aae);
  __l_82._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_82._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_82,
             in_stack_ffffffffffffe058);
  local_1588 = 0;
  uStack_1580 = 0;
  local_1578 = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x109b01);
  test_dry(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
           (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
           (int)((ulong)in_stack_ffffffffffffe0c0 >> 0x20),(int)in_stack_ffffffffffffe0c0,
           in_stack_ffffffffffffe0b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe040);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109b6a);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x109b84);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109b9e);
  local_15c8 = 0x3e4ccccd3e4ccccd;
  uStack_15c0 = 0x3e4ccccd3e4ccccd;
  local_15b8 = 0x3e4ccccd;
  local_15b0 = &local_15c8;
  local_15a8 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x109be9);
  __l_83._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_83._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_83,
             in_stack_ffffffffffffe058);
  uStack_1608 = 4;
  uStack_1604 = 0x100000000;
  local_1618 = 0x100000000;
  uStack_1610 = 2;
  local_160c = 3;
  local_15f8 = &local_1618;
  local_15f0 = 7;
  std::allocator<int>::allocator((allocator<int> *)0x109c5f);
  __l_84._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_84._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe060,__l_84,
             (allocator_type *)in_stack_ffffffffffffe058);
  local_1668 = 0x3e4ccccd3e4ccccd;
  uStack_1660 = 0x3e4ccccd3e4ccccd;
  local_1658 = 0x3e4ccccd;
  local_1648 = &local_1668;
  local_1640 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x109cd1);
  __l_85._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_85._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_85,
             in_stack_ffffffffffffe058);
  local_1688 = 0;
  uStack_1680 = 0;
  local_1678 = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x109d24);
  test_dry(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,in_stack_ffffffffffffe0d0,
           (float)((ulong)in_stack_ffffffffffffe0c8 >> 0x20),(float)in_stack_ffffffffffffe0c8,
           (int)((ulong)in_stack_ffffffffffffe0c0 >> 0x20),(int)in_stack_ffffffffffffe0c0,
           in_stack_ffffffffffffe0b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe040);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109d8d);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe040);
  std::allocator<int>::~allocator((allocator<int> *)0x109da7);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109dc1);
  local_16c0 = 0x3dcccccd;
  local_16bc = 0x3e4ccccd;
  local_16b8 = 0x3e99999a;
  local_16b4 = 0x3ecccccd;
  local_16b0 = &local_16c0;
  local_16a8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109e1e);
  __l_86._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_86._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_86,
             in_stack_ffffffffffffe058);
  local_1700 = 0x3f12492c;
  local_16fc = 0x3edb6da8;
  local_16f8 = 0;
  local_16f4 = 0;
  local_16f0 = &local_1700;
  local_16e8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109ea2);
  __l_87._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_87._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_87,
             in_stack_ffffffffffffe058);
  test_top_n_sigma(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,n);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109eff);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x109f19);
  local_1740 = 0x3dcccccd;
  local_173c = 0x3e4ccccd;
  local_1738 = 0x3e99999a;
  local_1734 = 0x3ecccccd;
  local_1730 = &local_1740;
  local_1728 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109f76);
  __l_88._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_88._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_88,
             in_stack_ffffffffffffe058);
  local_1780 = 0x3f800000;
  local_177c = 0;
  local_1778 = 0;
  local_1774 = 0;
  local_1770 = &local_1780;
  local_1768 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x109ffa);
  __l_89._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_89._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_89,
             in_stack_ffffffffffffe058);
  test_top_n_sigma(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,n);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10a054);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10a06e);
  local_17c0 = 0x3dcccccd;
  local_17bc = 0x3e4ccccd;
  local_17b8 = 0x3e99999a;
  local_17b4 = 0x3ecccccd;
  local_17b0 = &local_17c0;
  local_17a8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x10a0cb);
  __l_90._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_90._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_90,
             in_stack_ffffffffffffe058);
  local_1800 = 0x3ecccccd;
  local_17fc = 0x3e99999a;
  local_17f8 = 0x3e4ccccd;
  local_17f4 = 0x3dcccccd;
  local_17f0 = &local_1800;
  local_17e8 = 4;
  std::allocator<float>::allocator((allocator<float> *)0x10a14f);
  __l_91._M_len = (size_type)in_stack_ffffffffffffe070;
  __l_91._M_array = (iterator)in_stack_ffffffffffffe068;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe060,__l_91,
             in_stack_ffffffffffffe058);
  test_top_n_sigma(in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,n);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10a1ac);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe040);
  std::allocator<float>::~allocator((allocator<float> *)0x10a1c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1828);
  std::allocator<char>::~allocator(&local_1829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1850);
  std::allocator<char>::~allocator(&local_1851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1878);
  std::allocator<char>::~allocator(&local_1879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_18a0);
  std::allocator<char>::~allocator(&local_18a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_18c8);
  std::allocator<char>::~allocator(&local_18c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_18f0);
  std::allocator<char>::~allocator(&local_18f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1918);
  std::allocator<char>::~allocator(&local_1919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1940);
  std::allocator<char>::~allocator(&local_1941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1968);
  std::allocator<char>::~allocator(&local_1969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1990);
  std::allocator<char>::~allocator(&local_1991);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_19b8);
  std::allocator<char>::~allocator(&local_19b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_19e0);
  std::allocator<char>::~allocator(&local_19e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1a08);
  std::allocator<char>::~allocator(&local_1a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1a30);
  std::allocator<char>::~allocator(&local_1a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1a58);
  std::allocator<char>::~allocator(&local_1a59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1a80);
  std::allocator<char>::~allocator(&local_1a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1aa8);
  std::allocator<char>::~allocator(&local_1aa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1ad0);
  std::allocator<char>::~allocator(&local_1ad1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe070,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1af8);
  std::allocator<char>::~allocator(&local_1af9);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)in_stack_ffffffffffffe068,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string((string *)(local_1b21 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b21);
  __s = &local_1b49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_ffffffffffffe060);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1b48);
  std::allocator<char>::~allocator(&local_1b49);
  __a = &local_1b71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1b70);
  std::allocator<char>::~allocator(&local_1b71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1b98);
  std::allocator<char>::~allocator(&local_1b99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  test_sampler_queue((size_t)local_1e70,samplers_sequence,(int)((ulong)puVar1 >> 0x20),
                     SUB84(puVar1,0),min_p);
  std::__cxx11::string::~string(local_1bc0);
  std::allocator<char>::~allocator(&local_1bc1);
  printf("OK\n");
  test_perf();
  return 0;
}

Assistant:

int main(void) {
    ggml_time_init();

    test_temp({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 1.0f);
    test_temp({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f, 0.0f, 0.0f, 0.0f}, 0.0f);

    test_temp_ext({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 1.0f, 0.0f, 1.0f);
    test_temp_ext({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f, 0.0f, 0.0f, 0.0f}, 0.0f, 0.0f, 1.0f);

    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f}, 1);
    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {0.44444f, 0.33333f, 0.22222f}, 3);
    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 4);
    test_top_k({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 0);

    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f}, 0);
    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.571429f, 0.428571f}, 0.7f);
    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.44444f, 0.33333f, 0.22222f}, 0.8f);
    test_top_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 1.0f);

    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/1.0f, 0.3f/1.0f, 0.2f/1.0f, 0.1f/1.0f}, 0.00f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/1.0f, 0.3f/1.0f, 0.2f/1.0f, 0.1f/1.0f}, 0.24f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.9f, 0.3f/0.9f, 0.2f/0.9f},            0.26f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.9f, 0.3f/0.9f, 0.2f/0.9f},            0.49f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.7f, 0.3f/0.7f},                       0.51f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.7f, 0.3f/0.7f},                       0.74f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.4f},                                  0.76f);
    test_min_p({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f/0.4f},                                  1.00f);

    printf("XTC should:\n");
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.1f},                                0.99f, 0.09f);
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.2f, 0.1f},                          0.99f, 0.19f);
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.3f, 0.2f, 0.1f},                    0.99f, 0.29f);

    printf("XTC should not:\n");
    test_xtc({0.4f, 0.3f, 0.2f, 0.1f},   {0.4f, 0.3f, 0.2f, 0.1f},              0.99f, 0.39f);

    test_typical({0.97f, 0.01f, 0.01f, 0.01f}, {0.97f}, 0.5f);
    test_typical({0.4f, 0.2f, 0.2f, 0.2f}, {0.2f, 0.2f, 0.2f}, 0.5f);

    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0}, {0.25f, 0.25f, 0.25f, 0.25f, 0},   50.0f, 0.0f, 0.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2}, {0.5f, 0.5f, 0, 0, 0},       50.0f, 0.0f, 0.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 0, 0}, {0.5f, 0.5f, 0, 0, 0}, 50.0f, 0.0f, 0.0f);

    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0},             {0.249997f, 0.249997f, 0.249997f, 0.249997f, 0.000011f}, 1.0f, 5.0f, 5.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2},       {0.499966f, 0.499966f, 0.000023f, 0.000023f, 0.000023f}, 1.0f, 5.0f, 5.0f);
    test_penalties({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 0, 0}, {0.499977f, 0.499977f, 0.000023f, 0.000023f, 0.000000f}, 1.0f, 5.0f, 5.0f);


    test_dry({0.25f, 0.25f, 0.25f, 0.25f}, {0, 1}, {0.25f, 0.25f, 0.25f, 0.25f}, 1.0f, 1.1f, 2, 4, {});
    test_dry({0.25f, 0.25f, 0.25f, 0.25f}, {0, 1, 2, 0, 1}, {0.296923f, 0.296923f, 0.296923f, 0.109232f}, 1.0f, 1.1f, 2, 5, {});
    test_dry({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 3, 4, 0, 1}, {0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, 1.0f, 1.1f, 2, 6, {{3}});
    test_dry({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 0, 1}, {0.241818f, 0.241818f, 0.241818f, 0.241818f, 0.032727f}, 2.0f, 1.1f, 2, 5, {});
    test_dry({0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, {0, 1, 2, 3, 4, 0, 1}, {0.2f, 0.2f, 0.2f, 0.2f, 0.2f}, 1.0f, 1.1f, 4, 7, {});

    test_top_n_sigma({0.1f, 0.2f, 0.3f, 0.4f}, {0.571429f, 0.428571f, 0.0f, 0.0f}, 1.00f);
    test_top_n_sigma({0.1f, 0.2f, 0.3f, 0.4f}, {1.0f, 0.0f, 0.0f, 0.0f}, 0.00f);
    test_top_n_sigma({0.1f, 0.2f, 0.3f, 0.4f}, {0.4f, 0.3f, 0.2f, 0.1f}, 3.00f);

    test_sampler_queue(10000, "k", 10000, 1.0f, 1.0f);
    test_sampler_queue(10000, "k",     1, 1.0f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 1.0f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 0.0f, 1.0f);
    test_sampler_queue(10000, "m", 10000, 1.0f, 1.0f);
    test_sampler_queue(10000, "m", 10000, 1.0f, 1e-12);

    test_sampler_queue(10000, "k",   100, 1.0000f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 0.0002f, 1.0f);
    test_sampler_queue(10000, "p", 10000, 0.8000f, 1.0f);
    test_sampler_queue(10000, "m", 10000, 1.0000f, 9997.9f/9999.0f);
    test_sampler_queue(10000, "m", 10000, 1.0000f, 0.1f);

    test_sampler_queue(10000, "kp", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "km", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pk", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pm", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mk", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mp", 100, 0.8f, 9997.9f/9999.0f);
    test_sampler_queue(10000, "mp", 100, 0.8f, 0.1f);

    test_sampler_queue(10000, "kpm", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "kmp", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pkm", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "pmk", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mkp", 100, 0.8f, 0.1f);
    test_sampler_queue(10000, "mpk", 100, 0.8f, 0.1f);

    printf("OK\n");

    test_perf();

    return 0;
}